

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void GCTM(lua_State *L)

{
  lu_byte lVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  Table *events;
  lu_mem lVar5;
  StkId pTVar6;
  TValue *pTVar7;
  
  pgVar2 = L->l_G;
  pGVar3 = pgVar2->tmudata;
  pGVar4 = (pGVar3->gch).next;
  if (pGVar4 == pGVar3) {
    pgVar2->tmudata = (GCObject *)0x0;
  }
  else {
    (pGVar3->gch).next = (pGVar4->gch).next;
  }
  (pGVar4->gch).next = pgVar2->mainthread->next;
  pgVar2->mainthread->next = pGVar4;
  (pGVar4->gch).marked = pgVar2->currentwhite & 3 | (pGVar4->gch).marked & 0xf8;
  events = (pGVar4->h).metatable;
  if ((events == (Table *)0x0) || ((events->flags & 4) != 0)) {
    pTVar7 = (TValue *)0x0;
  }
  else {
    pTVar7 = luaT_gettm(events,TM_GC,L->l_G->tmname[2]);
  }
  if (pTVar7 != (TValue *)0x0) {
    lVar1 = L->allowhook;
    lVar5 = pgVar2->GCthreshold;
    L->allowhook = '\0';
    pgVar2->GCthreshold = pgVar2->totalbytes * 2;
    pTVar6 = L->top;
    pTVar6->value = pTVar7->value;
    pTVar6->tt = pTVar7->tt;
    pTVar6 = L->top;
    pTVar6[1].value.gc = pGVar4;
    pTVar6[1].tt = 7;
    pTVar6 = L->top;
    L->top = pTVar6 + 2;
    luaD_call(L,pTVar6,0);
    L->allowhook = lVar1;
    pgVar2->GCthreshold = lVar5;
  }
  return;
}

Assistant:

static void GCTM(lua_State*L){
global_State*g=G(L);
GCObject*o=g->tmudata->gch.next;
Udata*udata=rawgco2u(o);
const TValue*tm;
if(o==g->tmudata)
g->tmudata=NULL;
else
g->tmudata->gch.next=udata->uv.next;
udata->uv.next=g->mainthread->next;
g->mainthread->next=o;
makewhite(g,o);
tm=fasttm(L,udata->uv.metatable,TM_GC);
if(tm!=NULL){
lu_byte oldah=L->allowhook;
lu_mem oldt=g->GCthreshold;
L->allowhook=0;
g->GCthreshold=2*g->totalbytes;
setobj(L,L->top,tm);
setuvalue(L,L->top+1,udata);
L->top+=2;
luaD_call(L,L->top-2,0);
L->allowhook=oldah;
g->GCthreshold=oldt;
}
}